

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTextUsage.cpp
# Opt level: O1

EStatusCode RunCFFTest(char **argv,bool inEmbedFonts)

{
  pointer pcVar1;
  EStatusCode EVar2;
  EncryptionOptions *pEVar3;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *pPVar4;
  int iVar5;
  undefined7 in_register_00000031;
  char *pcVar6;
  char *pcVar7;
  PDFWriter pdfWriter;
  undefined1 local_1040 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1028;
  undefined1 local_1010 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ff0;
  _Alloc_hider local_fd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fc8;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  iVar5 = (int)CONCAT71(in_register_00000031,inEmbedFonts);
  pcVar6 = "SimpleTextUsageCFFNoEmbed.pdf";
  if (iVar5 != 0) {
    pcVar6 = "SimpleTextUsageCFF.pdf";
  }
  pcVar7 = pcVar6 + 0x1d;
  if (iVar5 != 0) {
    pcVar7 = pcVar6 + 0x16;
  }
  PDFWriter::PDFWriter(&local_ee0);
  local_fb0._M_dataplus._M_p = (pointer)&local_fb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fb0,pcVar6,pcVar7);
  BuildRelativeOutputPath(&local_f50,argv,&local_fb0);
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,"SimpleTextUsage.log","");
  BuildRelativeOutputPath(&local_f70,argv,&local_f90);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1040,true,true,&local_f70);
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar3->ShouldEncrypt;
  pcVar1 = (pEVar3->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar1,pcVar1 + (pEVar3->UserPassword)._M_string_length);
  local_f08 = pEVar3->UserProtectionOptionsFlag;
  pcVar1 = (pEVar3->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar1,pcVar1 + (pEVar3->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_1010,true,inEmbedFonts,(EncryptionOptions *)local_f30,
             false);
  EVar2 = PDFWriter::StartPDF(&local_ee0,&local_f50,ePDFVersion13,(LogConfiguration *)local_1040,
                              (PDFCreationSettings *)local_1010);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd8._M_p != &local_fc8) {
    operator_delete(local_fd8._M_p,local_fc8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1010._16_8_ != &local_ff0) {
    operator_delete((void *)local_1010._16_8_,local_ff0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1040._8_8_ != &local_1028) {
    operator_delete((void *)local_1040._8_8_,local_1028._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p,local_f90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb0._M_dataplus._M_p != &local_fb0.field_2) {
    operator_delete(local_fb0._M_dataplus._M_p,local_fb0.field_2._M_allocated_capacity + 1);
  }
  if (EVar2 == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)local_1010,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)local_1010);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_1010);
    inPageContext = PDFWriter::StartPageContentContext(&local_ee0,this);
    if (inPageContext == (PageContentContext *)0x0) {
      EVar2 = eFailure;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"failed to create content context for page\n",0x2a);
    }
    else {
      local_1040._0_8_ = local_1040 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1040,"fonts/BrushScriptStd.otf","");
      BuildRelativeInputPath((string *)local_1010,argv,(string *)local_1040);
      pPVar4 = PDFWriter::GetFontForFile(&local_ee0,(string *)local_1010,0);
      pcVar1 = local_1010 + 0x10;
      if ((pointer)local_1010._0_8_ != pcVar1) {
        operator_delete((void *)local_1010._0_8_,(ulong)(local_1010._16_8_ + 1));
      }
      if ((undefined1 *)local_1040._0_8_ != local_1040 + 0x10) {
        operator_delete((void *)local_1040._0_8_,local_1040._16_8_ + 1);
      }
      if (pPVar4 == (PDFUsedFont *)0x0) {
        EVar2 = eFailure;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Failed to create font object for brushscriptstd.otf\n",
                   0x34);
      }
      else {
        AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
        AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,pPVar4,1.0);
        AbstractContentContext::Tm
                  (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
        local_1010._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1010,"abcd","");
        EVar2 = AbstractContentContext::Tj
                          (&inPageContext->super_AbstractContentContext,(string *)local_1010);
        if ((pointer)local_1010._0_8_ != pcVar1) {
          operator_delete((void *)local_1010._0_8_,(ulong)(local_1010._16_8_ + 1));
        }
        if (EVar2 != eSuccess) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Could not find some of the glyphs for this font (BrushScriptStd)",0x40);
        }
        AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
        local_1040._0_8_ = local_1040 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1040,"fonts/KozGoPro-Regular.otf","");
        BuildRelativeInputPath((string *)local_1010,argv,(string *)local_1040);
        pPVar4 = PDFWriter::GetFontForFile(&local_ee0,(string *)local_1010,0);
        if ((pointer)local_1010._0_8_ != pcVar1) {
          operator_delete((void *)local_1010._0_8_,(ulong)(local_1010._16_8_ + 1));
        }
        if ((undefined1 *)local_1040._0_8_ != local_1040 + 0x10) {
          operator_delete((void *)local_1040._0_8_,local_1040._16_8_ + 1);
        }
        if (pPVar4 == (PDFUsedFont *)0x0) {
          EVar2 = eFailure;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Failed to create font object for KozGoPro-Regular.otf\n"
                     ,0x36);
        }
        else {
          AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,pPVar4,1.0);
          AbstractContentContext::Tm
                    (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,400.8997
                    );
          local_1010._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1010,"abcd","");
          EVar2 = AbstractContentContext::Tj
                            (&inPageContext->super_AbstractContentContext,(string *)local_1010);
          if ((pointer)local_1010._0_8_ != pcVar1) {
            operator_delete((void *)local_1010._0_8_,(ulong)(local_1010._16_8_ + 1));
          }
          if (EVar2 != eSuccess) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Could not find some of the glyphs for this font (Kozuka)",0x38);
          }
          AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
          EVar2 = PDFWriter::EndPageContentContext(&local_ee0,inPageContext);
          if (EVar2 == eSuccess) {
            EVar2 = PDFWriter::WritePageAndRelease(&local_ee0,this);
            if (EVar2 == eSuccess) {
              EVar2 = PDFWriter::EndPDF(&local_ee0);
              if (EVar2 == eSuccess) {
                EVar2 = eSuccess;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"failed in end PDF\n",0x12);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed to write page\n",0x15);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"failed to end page content context\n",0x23);
          }
        }
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start PDF\n",0x14);
  }
  PDFWriter::~PDFWriter(&local_ee0);
  return EVar2;
}

Assistant:

static EStatusCode RunCFFTest(char* argv[],bool inEmbedFonts)
{
	PDFWriter pdfWriter;
	EStatusCode status; 

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv, inEmbedFonts ? "SimpleTextUsageCFF.pdf" : "SimpleTextUsageCFFNoEmbed.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,
                                                     BuildRelativeOutputPath(argv,"SimpleTextUsage.log")),
													 PDFCreationSettings(true, inEmbedFonts));
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);
		if(NULL == contentContext)
		{
			status = PDFHummus::eFailure;
			cout<<"failed to create content context for page\n";
			break;
		}

		PDFUsedFont* font = pdfWriter.GetFontForFile(
                                                     BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/BrushScriptStd.otf"));
		if(!font)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for brushscriptstd.otf\n";
			break;
		}

		// Draw some text
		contentContext->BT();
		contentContext->k(0,0,0,1);

		contentContext->Tf(font,1);

		contentContext->Tm(30,0,0,30,78.4252,662.8997);

		EStatusCode encodingStatus = contentContext->Tj("abcd");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font (BrushScriptStd)";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		// now write some more text with kozuka font
		contentContext->BT();
		contentContext->k(0,0,0,1);

		PDFUsedFont* fontK = pdfWriter.GetFontForFile(
                                                      BuildRelativeInputPath(
                                                                             argv,
                                                                             "fonts/KozGoPro-Regular.otf"));
		if(!fontK)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for KozGoPro-Regular.otf\n";
			break;
		}

		contentContext->Tf(fontK,1);

		contentContext->Tm(30,0,0,30,78.4252,400.8997);

		encodingStatus = contentContext->Tj("abcd");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font (Kozuka)";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}
	}while(false);
	return status;	

}